

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  char *pcVar1;
  char **__s;
  allocator<char> local_41;
  char **local_40;
  char *current;
  UIntToStringBuffer buffer;
  LargestInt value_local;
  
  local_40 = (char **)(buffer + 0x11);
  unique0x10000131 = this;
  if (this == (Json *)0x8000000000000000) {
    uintToString(0x8000000000000000,(char **)&local_40);
    pcVar1 = (char *)((long)local_40 + -1);
    local_40 = (char **)((long)local_40 + -1);
    *pcVar1 = '-';
  }
  else if ((long)this < 0) {
    uintToString(-(long)this,(char **)&local_40);
    pcVar1 = (char *)((long)local_40 + -1);
    local_40 = (char **)((long)local_40 + -1);
    *pcVar1 = '-';
  }
  else {
    uintToString((LargestUInt)this,(char **)&local_40);
  }
  __s = local_40;
  if (local_40 < &current) {
    __assert_fail("current >= buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                  ,0x94,"std::string Json::valueToString(LargestInt)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)__s,&local_41);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  if (value == Value::minLargestInt) {
    uintToString(LargestUInt(Value::maxLargestInt) + 1, current);
    *--current = '-';
  } else if (value < 0) {
    uintToString(LargestUInt(-value), current);
    *--current = '-';
  } else {
    uintToString(LargestUInt(value), current);
  }
  assert(current >= buffer);
  return current;
}